

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

stbtt_uint32 stbtt__buf_get(stbtt__buf *b,int n)

{
  byte bVar1;
  int local_1c;
  uint local_18;
  int i;
  stbtt_uint32 v;
  int n_local;
  stbtt__buf *b_local;
  
  local_18 = 0;
  if (n < 1 || 4 < n) {
    __assert_fail("n >= 1 && n <= 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imstb_truetype.h"
                  ,0x48f,"stbtt_uint32 stbtt__buf_get(stbtt__buf *, int)");
  }
  for (local_1c = 0; local_1c < n; local_1c = local_1c + 1) {
    bVar1 = stbtt__buf_get8(b);
    local_18 = local_18 << 8 | (uint)bVar1;
  }
  return local_18;
}

Assistant:

static stbtt_uint32 stbtt__buf_get(stbtt__buf *b, int n)
{
   stbtt_uint32 v = 0;
   int i;
   STBTT_assert(n >= 1 && n <= 4);
   for (i = 0; i < n; i++)
      v = (v << 8) | stbtt__buf_get8(b);
   return v;
}